

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::ConnectOrder
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,int connect)

{
  byte bVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  TPZConnect *this_00;
  int in_ESI;
  long *in_RDI;
  TPZConnect *c;
  stringstream sout;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [380];
  int local_14;
  int local_4;
  
  if ((-1 < in_ESI) && (local_14 = in_ESI, iVar2 = (**(code **)(*in_RDI + 0x90))(), in_ESI < iVar2))
  {
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x13),(long)local_14);
    if (*plVar3 == -1) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      poVar4 = std::operator<<(local_190,
                               "virtual int TPZCompElHDiv<pzshape::TPZShapeQuad>::ConnectOrder(int) const [TSHAPE = pzshape::TPZShapeQuad]"
                              );
      poVar4 = std::operator<<(poVar4," connect ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
      poVar4 = std::operator<<(poVar4," is not initialized");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::stringstream::str();
      poVar4 = std::operator<<((ostream *)&std::cout,local_1d0);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1d0);
      local_4 = 0;
      std::__cxx11::stringstream::~stringstream(local_1a0);
      return local_4;
    }
    this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_14);
    bVar1 = TPZConnect::Order(this_00);
    return (uint)bVar1;
  }
  return -1;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::ConnectOrder(int connect) const{
	if (connect < 0 || connect >= this->NConnects()){
#ifdef PZ_LOG
		{
			std::stringstream sout;
			sout << "Connect index out of range connect " << connect <<
			" nconnects " << NConnects();
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		return -1;
	}

	if (this->fConnectIndexes[connect] == -1) {
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " connect " << connect
		<< " is not initialized" << std::endl;
#ifdef PZ_LOG
		LOGPZ_ERROR(logger,sout.str());
#else
		std::cout << sout.str() << std::endl;
#endif
		return 0;
	}

    TPZConnect &c = this-> Connect(connect);
    return c.Order();
}